

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_parseDataListTest_Test::TestBody
          (OpenDDLParserTest_parseDataListTest_Test *this)

{
  Reference *pRVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  string *this_00;
  long lVar5;
  Reference **ppRVar6;
  AssertHelper local_100;
  AssertionResult gtest_ar__3;
  Value *data;
  AssertHelper local_e0;
  char token2 [23];
  string expStrings [2];
  Reference *refs;
  int res;
  list<int,_std::allocator<int>_> expValues;
  size_t numValues;
  char token1 [10];
  size_t numRefs;
  
  data = (Value *)0x0;
  builtin_strncpy(token1,"{1,2,3,4}",10);
  sVar3 = strlen(token1);
  ppRVar6 = &refs;
  refs = (Reference *)0x0;
  numRefs = 0;
  numValues = 0;
  pcVar4 = OpenDDLParser::parseDataList
                     (token1,token1 + sVar3,ddl_none,&data,&numValues,ppRVar6,&numRefs);
  expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)
            CONCAT71(expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                     super__List_node_base._M_next._1_7_,pcVar4 != (char *)0x0);
  if (pcVar4 == (char *)0x0) {
    testing::Message::Message((Message *)token2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (expStrings,(internal *)&expValues,(AssertionResult *)"nullptr == in","true","false",
               (char *)ppRVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x26f,(char *)CONCAT44(expStrings[0]._M_dataplus._M_p._4_4_,
                                       expStrings[0]._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)token2);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_prev);
    expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_prev = (_List_node_base *)0x0;
    expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_next = (_List_node_base *)
              CONCAT71(expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                       super__List_node_base._M_next._1_7_,data != (Value *)0x0);
    if (data != (Value *)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                      super__List_node_base._M_prev);
      expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next = (_List_node_base *)&expValues;
      expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
      expStrings[0]._M_dataplus._M_p._0_4_ = 1;
      expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_prev = expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)
                 expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next,(value_type_conflict1 *)expStrings);
      expStrings[0]._M_dataplus._M_p._0_4_ = 2;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (&expValues,(value_type_conflict1 *)expStrings);
      expStrings[0]._M_dataplus._M_p._0_4_ = 3;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (&expValues,(value_type_conflict1 *)expStrings);
      expStrings[0]._M_dataplus._M_p._0_4_ = 4;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (&expValues,(value_type_conflict1 *)expStrings);
      gtest_ar__3._0_4_ = 4;
      token2._0_8_ = countItems(data);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)expStrings,"4U","countItems(data)",(uint *)&gtest_ar__3,
                 (unsigned_long *)token2);
      if ((char)expStrings[0]._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)token2);
        if (expStrings[0]._M_string_length == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)expStrings[0]._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x278,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)token2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)token2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expStrings[0]._M_string_length);
      bVar2 = testValues<int>(ddl_int32,data,&expValues);
      token2[0] = bVar2;
      token2[8] = '\0';
      token2[9] = '\0';
      token2[10] = '\0';
      token2[0xb] = '\0';
      token2[0xc] = '\0';
      token2[0xd] = '\0';
      token2[0xe] = '\0';
      token2[0xf] = '\0';
      if (!bVar2) {
        testing::Message::Message((Message *)&gtest_ar__3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (expStrings,(internal *)token2,
                   (AssertionResult *)"testValues(Value::ValueType::ddl_int32, data, expValues)",
                   "false","true",(char *)ppRVar6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x279,(char *)CONCAT44(expStrings[0]._M_dataplus._M_p._4_4_,
                                           expStrings[0]._M_dataplus._M_p._0_4_));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_ar__3);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)expStrings);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__3);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(token2 + 8));
      OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,data);
      pRVar1 = refs;
      if (refs != (Reference *)0x0) {
        Reference::~Reference(refs);
      }
      operator_delete(pRVar1,0x10);
      builtin_strncpy(token2,"{ \"string1\",\"string2\"}",0x17);
      sVar3 = strlen(token2);
      ppRVar6 = &refs;
      OpenDDLParser::parseDataList(token2,token2 + sVar3,ddl_none,&data,&numValues,ppRVar6,&numRefs)
      ;
      gtest_ar__3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar__3.success_ = data != (Value *)0x0;
      if (data == (Value *)0x0) {
        testing::Message::Message((Message *)&local_100);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (expStrings,(internal *)&gtest_ar__3,(AssertionResult *)"nullptr == data","true",
                   "false",(char *)ppRVar6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x280,(char *)CONCAT44(expStrings[0]._M_dataplus._M_p._4_4_,
                                           expStrings[0]._M_dataplus._M_p._0_4_));
        testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)expStrings);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_100);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__3.message_);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__3.message_);
        local_100.data_._0_4_ = 2;
        gtest_ar__3._0_8_ = countItems(data);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)expStrings,"2U","countItems(data)",(uint *)&local_100,
                   (unsigned_long *)&gtest_ar__3);
        if ((char)expStrings[0]._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&gtest_ar__3);
          if (expStrings[0]._M_string_length == 0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)expStrings[0]._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                     ,0x283,pcVar4);
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&gtest_ar__3);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__3);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&expStrings[0]._M_string_length);
        this_00 = expStrings;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)this_00,"string1",(allocator<char> *)&gtest_ar__3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(expStrings + 1),"string2",(allocator<char> *)&local_100);
        for (; pRVar1 = refs, data != (Value *)0x0; data = data->m_next) {
          res = strncmp((this_00->_M_dataplus)._M_p,(char *)data->m_data,data->m_size);
          local_100.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar__3,"0","res",(int *)&local_100,&res);
          if (gtest_ar__3.success_ == false) {
            testing::Message::Message((Message *)&local_100);
            pcVar4 = "";
            if (gtest_ar__3.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = ((gtest_ar__3.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                       ,0x28b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_100);
            testing::internal::AssertHelper::~AssertHelper(&local_e0);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_100);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__3.message_);
          this_00 = this_00 + 1;
        }
        if (refs != (Reference *)0x0) {
          Reference::~Reference(refs);
        }
        operator_delete(pRVar1,0x10);
        lVar5 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&expStrings[0]._M_dataplus._M_p + lVar5));
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != -0x20);
      }
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                (&expValues.super__List_base<int,_std::allocator<int>_>);
      return;
    }
    testing::Message::Message((Message *)token2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (expStrings,(internal *)&expValues,(AssertionResult *)"nullptr == data","true","false"
               ,(char *)ppRVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x270,(char *)CONCAT44(expStrings[0]._M_dataplus._M_p._4_4_,
                                       expStrings[0]._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)token2);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
  std::__cxx11::string::~string((string *)expStrings);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)token2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_prev);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseDataListTest) {
    Value *data(nullptr);
    size_t len(0);

    char *in(nullptr), *end(nullptr);
    char token1[] = "{1,2,3,4}";
    end = findEnd(token1, len);
    Reference *refs(nullptr);
    size_t numRefs(0), numValues(0);
    Value::ValueType type(Value::ValueType::ddl_none);
    in = OpenDDLParser::parseDataList(token1, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == in);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with integers
    std::list<int> expValues;
    expValues.push_back(1);
    expValues.push_back(2);
    expValues.push_back(3);
    expValues.push_back(4);
    EXPECT_EQ(4U, countItems(data));
    EXPECT_TRUE(testValues(Value::ValueType::ddl_int32, data, expValues));
    registerValueForDeletion(data);
    delete refs;

    char token2[] = "{ \"string1\",\"string2\"}";
    end = findEnd(token2, len);
    in = OpenDDLParser::parseDataList(token2, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with strings
    EXPECT_EQ(2U, countItems(data));
    std::string expStrings[2] = {
        "string1",
        "string2"
    };
    size_t i(0);
    while (nullptr != data) {
        const int res(strncmp(expStrings[i].c_str(), (char *)data->m_data, data->m_size));
        EXPECT_EQ(0, res);
        data = data->m_next;
        i++;
    }
    registerValueForDeletion(data);
    delete refs;
}